

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::SimplifyRecurrentAddExpression
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent_expr)

{
  ScalarEvolutionAnalysis *pSVar1;
  Loop *pLVar2;
  pointer ppSVar3;
  uint32_t uVar4;
  int iVar5;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> this_00;
  SENode *this_01;
  SENode *pSVar6;
  pointer ppSVar7;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_40;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_38;
  
  pSVar6 = this->node_;
  this_00.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       ::operator_new(0x48);
  pSVar1 = (recurrent_expr->super_SENode).parent_analysis_;
  pLVar2 = recurrent_expr->loop_;
  (((ChildContainerType *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8))->
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = (pointer)0x0
  ;
  *(pointer *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = (pointer)0x0
  ;
  *(ScalarEvolutionAnalysis **)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = pSVar1;
  uVar4 = SENode::NumberOfNodes;
  *(uint32_t *)
   ((long)this_00.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes + 1;
  *(undefined ***)
   this_00.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00a71098;
  *(Loop **)((long)this_00.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x40) =
       pLVar2;
  this_01 = (SENode *)::operator_new(0x30);
  (this_01->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = uVar4 + 2;
  this_01->unique_id_ = SENode::NumberOfNodes;
  this_01->_vptr_SENode = (_func_int **)&PTR_GetType_00a71208;
  SENode::AddChild(this_01,recurrent_expr->offset_);
  ppSVar3 = (pSVar6->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar7 = (pSVar6->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar3;
      ppSVar7 = ppSVar7 + 1) {
    pSVar6 = *ppSVar7;
    iVar5 = (**pSVar6->_vptr_SENode)(pSVar6);
    if (iVar5 != 1) {
      (*this_01->_vptr_SENode[3])(this_01,pSVar6);
    }
  }
  pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,this_01);
  iVar5 = (**pSVar6->_vptr_SENode)(pSVar6);
  if (iVar5 == 6) {
    local_38._M_head_impl = this_01;
    pSVar6 = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (this->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_38);
    SERecurrentNode::AddOffset(recurrent_expr,pSVar6);
    if (local_38._M_head_impl != (SENode *)0x0) {
      (*(local_38._M_head_impl)->_vptr_SENode[2])();
    }
    local_38._M_head_impl = (SENode *)0x0;
    this_01 = (SENode *)0x0;
  }
  else {
    SERecurrentNode::AddOffset
              ((SERecurrentNode *)
               this_00.
               super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
               .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,pSVar6);
  }
  SERecurrentNode::AddCoefficient
            ((SERecurrentNode *)
             this_00.
             super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
             .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,
             recurrent_expr->coefficient_);
  local_40._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       this_00.
       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
       super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
  pSVar6 = ScalarEvolutionAnalysis::GetCachedOrAdd
                     (this->analysis_,
                      (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                       *)&local_40);
  if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10
                ))();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)0x0;
  if (this_01 != (SENode *)0x0) {
    (*this_01->_vptr_SENode[2])(this_01);
  }
  return pSVar6;
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyRecurrentAddExpression(
    SERecurrentNode* recurrent_expr) {
  const std::vector<SENode*>& children = node_->GetChildren();

  std::unique_ptr<SERecurrentNode> recurrent_node{new SERecurrentNode(
      recurrent_expr->GetParentAnalysis(), recurrent_expr->GetLoop())};

  // Create and simplify the new offset node.
  std::unique_ptr<SENode> new_offset{
      new SEAddNode(recurrent_expr->GetParentAnalysis())};
  new_offset->AddChild(recurrent_expr->GetOffset());

  for (SENode* child : children) {
    if (child->GetType() != SENode::RecurrentAddExpr) {
      new_offset->AddChild(child);
    }
  }

  // Simplify the new offset.
  SENode* simplified_child = analysis_.SimplifyExpression(new_offset.get());

  // If the child can be simplified, add the simplified form otherwise, add it
  // via the usual caching mechanism.
  if (simplified_child->GetType() != SENode::CanNotCompute) {
    recurrent_node->AddOffset(simplified_child);
  } else {
    recurrent_expr->AddOffset(analysis_.GetCachedOrAdd(std::move(new_offset)));
  }

  recurrent_node->AddCoefficient(recurrent_expr->GetCoefficient());

  return analysis_.GetCachedOrAdd(std::move(recurrent_node));
}